

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

ostream * L12_1::operator<<(ostream *os,String *str)

{
  String *str_local;
  ostream *os_local;
  
  std::operator<<(os,str->_p_str);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream &os, const String &str) {
        os << str._p_str;
        return os;
    }